

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O0

void __thiscall
hwtest::pgraph::MthdKelvinTlProgramStartPos::emulate_mthd(MthdKelvinTlProgramStartPos *this)

{
  int iVar1;
  MthdKelvinTlProgramStartPos *this_local;
  
  pgraph_kelvin_check_err19(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  iVar1 = pgraph_3d_class(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  if (iVar1 < 6) {
    pgraph_kelvin_check_err18(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  }
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource == 0) {
    if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
        chipset.card_type < 0x40) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xf_mode_a =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xf_mode_a & 0xffff00ff |
           ((this->super_SingleMthdTest).super_MthdTest.val & 0xff) << 8;
      pgraph_flush_xf_mode(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
    }
    else {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_xf_c =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_xf_c & 0xfffffc00
           | (this->super_SingleMthdTest).super_MthdTest.val & 0x3ff;
      pgraph_bundle(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x5f,0,
                    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_xf_c,true
                   );
    }
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_kelvin_check_err19(&exp);
		if (pgraph_3d_class(&exp) < PGRAPH_3D_CURIE)
			pgraph_kelvin_check_err18(&exp);
		if (!exp.nsource) {
			if (chipset.card_type < 0x40) {
				// Ummm.... won't fit on Rankine.
				insrt(exp.xf_mode_a, 8, 8, val);
				pgraph_flush_xf_mode(&exp);
			} else {
				insrt(exp.bundle_xf_c, 0, 10, val);
				pgraph_bundle(&exp, BUNDLE_XF_C, 0, exp.bundle_xf_c, true);
			}
		}
	}